

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

int __thiscall zmq::session_base_t::push_msg(session_base_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t in_RCX;
  void *__buf;
  EVP_PKEY_CTX *ctx;
  
  bVar1 = msg_t::flags(msg_);
  if ((((bVar1 & 2) == 0) || (bVar1 = (msg_->_u).base.flags & 0x1c, bVar1 == 0x10)) ||
     (iVar2 = 0, bVar1 == 0xc)) {
    if ((this->_pipe != (pipe_t *)0x0) &&
       (ctx = (EVP_PKEY_CTX *)msg_, sVar3 = pipe_t::write(this->_pipe,(int)msg_,__buf,in_RCX),
       (char)sVar3 != '\0')) {
      iVar2 = msg_t::init(msg_,ctx);
      if (iVar2 == 0) {
        return 0;
      }
      push_msg();
      return 0;
    }
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int zmq::session_base_t::push_msg (msg_t *msg_)
{
    //  pass subscribe/cancel to the sockets
    if ((msg_->flags () & msg_t::command) && !msg_->is_subscribe ()
        && !msg_->is_cancel ())
        return 0;
    if (_pipe && _pipe->write (msg_)) {
        const int rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    errno = EAGAIN;
    return -1;
}